

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_same_tangent(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_INT local_118;
  REF_INT local_114;
  int local_110;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_DBL dot;
  REF_DBL tangent1 [3];
  double local_d8;
  REF_DBL tangent0 [3];
  int local_b8;
  REF_INT ixyz;
  REF_INT node;
  REF_INT other;
  REF_INT cell;
  REF_INT item;
  REF_INT nodes [27];
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT remove_local;
  REF_INT keep_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  unique0x00012000 = ref_grid->cell[0];
  *allowed = 1;
  if ((remove < 0) || (unique0x00012000->ref_adj->nnode <= remove)) {
    local_110 = -1;
  }
  else {
    local_110 = unique0x00012000->ref_adj->first[remove];
  }
  other = local_110;
  if (local_110 == -1) {
    local_114 = -1;
  }
  else {
    local_114 = unique0x00012000->ref_adj->item[local_110].ref;
  }
  node = local_114;
  do {
    if (other == -1) {
      return 0;
    }
    if ((keep != stack0xffffffffffffffc8->c2n[stack0xffffffffffffffc8->size_per * node]) &&
       (keep != stack0xffffffffffffffc8->c2n[stack0xffffffffffffffc8->size_per * node + 1])) {
      uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,node,&cell);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x454,"ref_collapse_edge_same_tangent",(ulong)uVar2,"nodes");
        return uVar2;
      }
      ixyz = -1;
      for (local_b8 = 0; local_b8 < stack0xffffffffffffffc8->node_per; local_b8 = local_b8 + 1) {
        if ((&cell)[local_b8] != remove) {
          ixyz = (&cell)[local_b8];
        }
      }
      if (ixyz == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x45b,"ref_collapse_edge_same_tangent","other not found");
        return 1;
      }
      for (tangent0[2]._4_4_ = 0; tangent0[2]._4_4_ < 3; tangent0[2]._4_4_ = tangent0[2]._4_4_ + 1)
      {
        tangent0[(long)tangent0[2]._4_4_ + -1] =
             pRVar1->real[tangent0[2]._4_4_ + remove * 0xf] -
             pRVar1->real[tangent0[2]._4_4_ + ixyz * 0xf];
        tangent1[(long)tangent0[2]._4_4_ + -1] =
             pRVar1->real[tangent0[2]._4_4_ + keep * 0xf] -
             pRVar1->real[tangent0[2]._4_4_ + ixyz * 0xf];
      }
      uVar2 = ref_math_normalize(&local_d8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x462,"ref_collapse_edge_same_tangent",(ulong)uVar2,"zero length orig quad");
        return uVar2;
      }
      RVar3 = ref_math_normalize(&dot);
      if (RVar3 == 4) {
        *allowed = 0;
        return 0;
      }
      if (tangent0[1] * tangent1[1] + local_d8 * dot + tangent0[0] * tangent1[0] <
          pRVar1->same_normal_tol) {
        *allowed = 0;
        return 0;
      }
    }
    other = stack0xffffffffffffffc8->ref_adj->item[other].next;
    if (other == -1) {
      local_118 = -1;
    }
    else {
      local_118 = stack0xffffffffffffffc8->ref_adj->item[other].ref;
    }
    node = local_118;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_tangent(REF_GRID ref_grid,
                                                  REF_INT keep, REF_INT remove,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell;
  REF_INT other, node, ixyz;
  REF_DBL tangent0[3], tangent1[3];
  REF_DBL dot;
  REF_STATUS status;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    /* a quad with keep and remove will be removed */
    if (keep == ref_cell_c2n(ref_cell, 0, cell) ||
        keep == ref_cell_c2n(ref_cell, 1, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    other = REF_EMPTY;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (nodes[node] != remove) {
        other = nodes[node];
      }
    }
    RAS(REF_EMPTY != other, "other not found");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      tangent0[ixyz] = ref_node_xyz(ref_node, ixyz, remove) -
                       ref_node_xyz(ref_node, ixyz, other);
      tangent1[ixyz] = ref_node_xyz(ref_node, ixyz, keep) -
                       ref_node_xyz(ref_node, ixyz, other);
    }
    RSS(ref_math_normalize(tangent0), "zero length orig quad");
    status = ref_math_normalize(tangent1);
    if (REF_DIV_ZERO == status) { /* new quad face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    dot = ref_math_dot(tangent0, tangent1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}